

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O1

bool Unit_Test::verifyImage
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,uint8_t value)

{
  uint uVar1;
  uint32_t uVar2;
  imageException *this;
  uint uVar3;
  ulong uVar4;
  uint32_t uVar5;
  uchar *puVar6;
  uchar *puVar7;
  bool bVar8;
  
  if ((((height != 0) && (width != 0)) && (image->_data != (uchar *)0x0)) &&
     ((width + x <= image->_width && (height + y <= image->_height)))) {
    uVar3 = width * image->_colorCount;
    uVar1 = image->_rowSize;
    uVar5 = height;
    if (uVar1 == uVar3) {
      uVar2 = 1;
      if (uVar3 < 0xffffffff / height) {
        uVar5 = 1;
        uVar2 = height;
      }
      uVar3 = uVar2 * uVar3;
    }
    bVar8 = uVar5 * uVar1 == 0;
    if (!bVar8) {
      puVar7 = image->_data + (ulong)(image->_colorCount * x) + (ulong)(y * uVar1);
      puVar6 = puVar7 + uVar5 * uVar1;
      do {
        if (uVar3 != 0) {
          uVar4 = 0;
          do {
            if (puVar7[uVar4] != value) {
              return bVar8;
            }
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        puVar7 = puVar7 + uVar1;
        bVar8 = puVar7 == puVar6;
      } while (!bVar8);
    }
    return bVar8;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Bad input parameters in image function");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

bool verifyImage( const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, uint8_t value )
    {
        if( image.empty() || width == 0 || height == 0 || x + width > image.width() || y + height > image.height() )
            throw imageException( "Bad input parameters in image function" );

        width = width * image.colorCount();
        Image_Function::OptimiseRoi( width, height, image );

        const uint32_t rowSize  = image.rowSize();
        const uint8_t * outputY = image.data() + y * rowSize + x * image.colorCount();
        const uint8_t * endY    = outputY + rowSize * height;

        for ( ; outputY != endY; outputY += rowSize ) {
            const uint8_t * outputX = outputY;
            const uint8_t * endX    = outputX + width;

            for( ; outputX != endX; ++outputX ) {
                if( (*outputX) != value )
                    return false;
            }
        }

        return true;
    }